

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

void Mvc_CoverMakeCubeFree(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  Mvc_Cube_t *pMVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  Mvc_CoverAllocateMask(pCover);
  Mvc_CoverCommonCube(pCover,pCover->pMask);
  for (pMVar2 = (pCover->lCubes).pHead; pMVar2 != (Mvc_Cube_t *)0x0; pMVar2 = pMVar2->pNext) {
    uVar5 = *(uint *)&pMVar2->field_0x8 & 0xffffff;
    if (uVar5 == 0) {
      pMVar2->pData[0] = pMVar2->pData[0] & ~pCover->pMask->pData[0];
    }
    else if (uVar5 == 1) {
      pMVar1 = pCover->pMask;
      pMVar2->pData[0] = pMVar2->pData[0] & ~pMVar1->pData[0];
      *(uint *)&pMVar2->field_0x14 = *(uint *)&pMVar2->field_0x14 & ~*(uint *)&pMVar1->field_0x14;
    }
    else {
      pMVar1 = pCover->pMask;
      lVar3 = (ulong)(*(uint *)&pMVar2->field_0x8 & 0xffffff) + 4;
      do {
        pMVar2->pData[lVar3 + -4] = pMVar2->pData[lVar3 + -4] & ~pMVar1->pData[lVar3 + -4];
        lVar4 = lVar3 + -4;
        bVar6 = lVar3 != 4;
        lVar3 = lVar3 + -1;
      } while (bVar6 && -1 < lVar4);
    }
  }
  return;
}

Assistant:

void Mvc_CoverMakeCubeFree( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    // get the common cube
    Mvc_CoverAllocateMask( pCover );
    Mvc_CoverCommonCube( pCover, pCover->pMask );
    // remove this cube from the cubes in the cover
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubeBitSharp( pCube, pCube, pCover->pMask );
}